

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RazorAHRS.h
# Opt level: O0

int GetLatestDataRazorAHRS(RAZORAHRS *pRazorAHRS,RAZORAHRSDATA *pRazorAHRSData)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 local_3b8 [8];
  CHRONO chrono;
  double yaw;
  double pitch;
  double roll;
  char *ptr_YPRAG;
  char *ptr_YPR;
  int local_340;
  int recvbuflen;
  int Bytes;
  int BytesReceived;
  char savebuf [256];
  char recvbuf [512];
  RAZORAHRSDATA *pRazorAHRSData_local;
  RAZORAHRS *pRazorAHRS_local;
  
  recvbuflen = 0;
  local_340 = 0;
  chrono.Suspended = 0;
  chrono._68_4_ = 0;
  StartChrono((CHRONO *)local_3b8);
  memset(savebuf + 0xf8,0,0x200);
  memset(&Bytes,0,0x100);
  recvbuflen = 0;
  iVar1 = ReadRS232Port(&pRazorAHRS->RS232Port,(uint8 *)(savebuf + 0xf8),0xff,&local_340);
  if (iVar1 == 0) {
    if ((pRazorAHRS->bSaveRawData != 0) && (pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
      fwrite(savebuf + 0xf8,(long)local_340,1,(FILE *)pRazorAHRS->pfSaveFile);
      fflush((FILE *)pRazorAHRS->pfSaveFile);
    }
    recvbuflen = local_340 + recvbuflen;
    if (0xfe < recvbuflen) {
      while (local_340 == 0xff) {
        dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_3b8);
        if (4.0 < dVar2) {
          printf("Error reading data from a RazorAHRS : Message timeout. \n");
          return 2;
        }
        memcpy(&Bytes,savebuf + 0xf8,(long)local_340);
        iVar1 = ReadRS232Port(&pRazorAHRS->RS232Port,(uint8 *)(savebuf + 0xf8),0xff,&local_340);
        if (iVar1 != 0) {
          printf("Error reading data from a RazorAHRS. \n");
          return 1;
        }
        if ((pRazorAHRS->bSaveRawData != 0) && (pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
          fwrite(savebuf + 0xf8,(long)local_340,1,(FILE *)pRazorAHRS->pfSaveFile);
          fflush((FILE *)pRazorAHRS->pfSaveFile);
        }
        recvbuflen = local_340 + recvbuflen;
      }
      memmove(recvbuf + (0xf7 - (long)local_340),savebuf + 0xf8,(long)local_340);
      memcpy(savebuf + 0xf8,(void *)((long)&Bytes + (long)local_340),(long)(0xff - local_340));
      recvbuflen = 0xff;
    }
    ptr_YPRAG = FindLatestRazorAHRSSentence("#YPR=",savebuf + 0xf8);
    roll = (double)FindLatestRazorAHRSSentence("#YPRAG=",savebuf + 0xf8);
    while (ptr_YPRAG == (char *)0x0 && roll == 0.0) {
      dVar2 = GetTimeElapsedChronoQuick((CHRONO *)local_3b8);
      if (4.0 < dVar2) {
        printf("Error reading data from a RazorAHRS : Message timeout. \n");
        return 2;
      }
      if (0x1fe < recvbuflen) {
        printf("Error reading data from a RazorAHRS : Invalid data. \n");
        return 4;
      }
      iVar1 = ReadRS232Port(&pRazorAHRS->RS232Port,(uint8 *)(savebuf + (long)recvbuflen + 0xf8),
                            0x1ff - recvbuflen,&local_340);
      if (iVar1 != 0) {
        printf("Error reading data from a RazorAHRS. \n");
        return 1;
      }
      if ((pRazorAHRS->bSaveRawData != 0) && (pRazorAHRS->pfSaveFile != (FILE *)0x0)) {
        fwrite(savebuf + (long)recvbuflen + 0xf8,(long)local_340,1,(FILE *)pRazorAHRS->pfSaveFile);
        fflush((FILE *)pRazorAHRS->pfSaveFile);
      }
      recvbuflen = local_340 + recvbuflen;
      ptr_YPRAG = FindLatestRazorAHRSSentence("#YPR=",savebuf + 0xf8);
      roll = (double)FindLatestRazorAHRSSentence("#YPRAG=",savebuf + 0xf8);
    }
    memset(pRazorAHRSData,0,0x60);
    if (roll == 0.0) {
      iVar1 = __isoc99_sscanf(ptr_YPRAG,"#YPR=%lf,%lf,%lf",pRazorAHRSData,&pRazorAHRSData->pitch,
                              &pRazorAHRSData->roll);
      if (iVar1 != 3) {
        printf("Error reading data from a RazorAHRS : Invalid data. \n");
        return 1;
      }
    }
    else {
      iVar1 = __isoc99_sscanf(roll,"#YPRAG=%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf",pRazorAHRSData,
                              &pRazorAHRSData->pitch,&pRazorAHRSData->roll,&pRazorAHRSData->accx,
                              &pRazorAHRSData->accy,&pRazorAHRSData->accz,&pRazorAHRSData->gyrx,
                              &pRazorAHRSData->gyry,&pRazorAHRSData->gyrz);
      if (iVar1 != 9) {
        printf("Error reading data from a RazorAHRS : Invalid data. \n");
        return 1;
      }
    }
    dVar3 = (pRazorAHRSData->roll * 3.141592653589793) / 180.0;
    dVar4 = (pRazorAHRSData->pitch * 3.141592653589793) / 180.0;
    chrono._64_8_ = (pRazorAHRSData->yaw * 3.141592653589793) / 180.0;
    dVar2 = pRazorAHRS->rollorientation;
    dVar6 = pRazorAHRS->rollp1;
    dVar5 = cos(dVar3 + pRazorAHRS->rollp2);
    dVar2 = fmod_2PI(dVar6 * dVar5 + dVar3 + dVar2);
    pRazorAHRSData->Roll = dVar2;
    dVar2 = pRazorAHRS->pitchorientation;
    dVar6 = pRazorAHRS->pitchp1;
    dVar3 = cos(dVar4 + pRazorAHRS->pitchp2);
    dVar2 = fmod_2PI(dVar6 * dVar3 + dVar4 + dVar2);
    pRazorAHRSData->Pitch = dVar2;
    dVar6 = (double)chrono._64_8_ + pRazorAHRS->yaworientation;
    dVar2 = pRazorAHRS->yawp1;
    dVar3 = cos((double)chrono._64_8_ + pRazorAHRS->yawp2);
    dVar2 = fmod_2PI(dVar2 * dVar3 + dVar6);
    pRazorAHRSData->Yaw = dVar2;
    memcpy(&pRazorAHRS->LastRazorAHRSData,pRazorAHRSData,0x60);
    pRazorAHRS_local._4_4_ = 0;
  }
  else {
    printf("Error reading data from a RazorAHRS. \n");
    pRazorAHRS_local._4_4_ = 1;
  }
  return pRazorAHRS_local._4_4_;
}

Assistant:

inline int GetLatestDataRazorAHRS(RAZORAHRS* pRazorAHRS, RAZORAHRSDATA* pRazorAHRSData)
{
	char recvbuf[2*MAX_NB_BYTES_RAZORAHRS];
	char savebuf[MAX_NB_BYTES_RAZORAHRS];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr_YPR = NULL;
	char* ptr_YPRAG = NULL;
	double roll = 0, pitch = 0, yaw = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_RAZORAHRS-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pRazorAHRS->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RazorAHRS. \n");
		return EXIT_FAILURE;
	}
	if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile))
	{
		fwrite(recvbuf, Bytes, 1, pRazorAHRS->pfSaveFile);
		fflush(pRazorAHRS->pfSaveFile);
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RAZORAHRS)
			{
				printf("Error reading data from a RazorAHRS : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pRazorAHRS->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a RazorAHRS. \n");
				return EXIT_FAILURE;
			}
			if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
			{
				fwrite(recvbuf, Bytes, 1, pRazorAHRS->pfSaveFile);
				fflush(pRazorAHRS->pfSaveFile);
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	ptr_YPR = FindLatestRazorAHRSSentence("#YPR=", recvbuf);
	ptr_YPRAG = FindLatestRazorAHRSSentence("#YPRAG=", recvbuf);

	while ((!ptr_YPR)&&(!ptr_YPRAG))
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RAZORAHRS)
		{
			printf("Error reading data from a RazorAHRS : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_RAZORAHRS-1)
		{
			printf("Error reading data from a RazorAHRS : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pRazorAHRS->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_RAZORAHRS-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RazorAHRS. \n");
			return EXIT_FAILURE;
		}
		if ((pRazorAHRS->bSaveRawData)&&(pRazorAHRS->pfSaveFile)) 
		{
			fwrite((unsigned char*)recvbuf+BytesReceived, Bytes, 1, pRazorAHRS->pfSaveFile);
			fflush(pRazorAHRS->pfSaveFile);
		}
		BytesReceived += Bytes;
		ptr_YPR = FindLatestRazorAHRSSentence("#YPR=", recvbuf);
		ptr_YPRAG = FindLatestRazorAHRSSentence("#YPRAG=", recvbuf);
	}

	// Analyze data.

	memset(pRazorAHRSData, 0, sizeof(RAZORAHRSDATA));

	if (ptr_YPRAG)
	{
		if (sscanf(ptr_YPRAG, "#YPRAG=%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf,%lf",
			&pRazorAHRSData->yaw, &pRazorAHRSData->pitch, &pRazorAHRSData->roll, 
			&pRazorAHRSData->accx, &pRazorAHRSData->accy, &pRazorAHRSData->accz, 
			&pRazorAHRSData->gyrx, &pRazorAHRSData->gyry, &pRazorAHRSData->gyrz) != 9)
		{
			printf("Error reading data from a RazorAHRS : Invalid data. \n");
			return EXIT_FAILURE;
		}
	}
	else
	{
		if (sscanf(ptr_YPR, "#YPR=%lf,%lf,%lf",
			&pRazorAHRSData->yaw, &pRazorAHRSData->pitch, &pRazorAHRSData->roll) != 3)
		{
			printf("Error reading data from a RazorAHRS : Invalid data. \n");
			return EXIT_FAILURE;
		}
	}

	// Convert orientation information in angles in rad with corrections.

	roll = pRazorAHRSData->roll*M_PI/180.0;
	pitch = pRazorAHRSData->pitch*M_PI/180.0;
	yaw = pRazorAHRSData->yaw*M_PI/180.0;

	// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
	pRazorAHRSData->Roll = fmod_2PI(roll+pRazorAHRS->rollorientation+pRazorAHRS->rollp1*cos(roll+pRazorAHRS->rollp2));
	pRazorAHRSData->Pitch = fmod_2PI(pitch+pRazorAHRS->pitchorientation+pRazorAHRS->pitchp1*cos(pitch+pRazorAHRS->pitchp2));
	pRazorAHRSData->Yaw = fmod_2PI(yaw+pRazorAHRS->yaworientation+pRazorAHRS->yawp1*cos(yaw+pRazorAHRS->yawp2));

	pRazorAHRS->LastRazorAHRSData = *pRazorAHRSData;

	return EXIT_SUCCESS;
}